

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PUGIXML_DOMDocument.cpp
# Opt level: O2

DOMNodePtr __thiscall FIX::PUGIXML_DOMNode::getFirstChildNode(PUGIXML_DOMNode *this)

{
  bool bVar1;
  _func_int **pp_Var2;
  long in_RSI;
  xml_node pNode;
  
  pNode = pugi::xml_node::first_child((xml_node *)(in_RSI + 8));
  bVar1 = pugi::xml_node::operator!(&pNode);
  if (bVar1) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)operator_new(0x10);
    *pp_Var2 = (_func_int *)&PTR__DOMNode_001fdb10;
    pp_Var2[1] = (_func_int *)pNode._root;
  }
  (this->super_DOMNode)._vptr_DOMNode = pp_Var2;
  return (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)
         (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)this;
}

Assistant:

DOMNodePtr PUGIXML_DOMNode::getFirstChildNode()
  {
    pugi::xml_node pNode = m_pNode.first_child();
    if( !pNode ) return DOMNodePtr();
    return DOMNodePtr(new PUGIXML_DOMNode(pNode));
  }